

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

iterator anon_unknown.dwarf_898aa::TransformConfigure
                   (TransformAction action,
                   unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                   *selector,size_t arity)

{
  bool bVar1;
  pointer pAVar2;
  transform_error *ptVar3;
  pointer pAVar4;
  pair<std::_Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor>,_bool> pVar5;
  unique_ptr<(anonymous_namespace)::TransformNoSelector,_std::default_delete<(anonymous_namespace)::TransformNoSelector>_>
  local_1d0;
  undefined1 local_1c1;
  string local_1c0;
  undefined1 local_199;
  string local_198;
  string local_178;
  _Self local_158;
  ActionDescriptor local_150;
  _Base_ptr local_118;
  undefined1 local_110;
  unique_ptr<(anonymous_namespace)::TransformActionReplace,_std::default_delete<(anonymous_namespace)::TransformActionReplace>_>
  local_108;
  int local_100 [2];
  _Base_ptr local_f8;
  undefined1 local_f0;
  unique_ptr<(anonymous_namespace)::TransformActionGenexStrip,_std::default_delete<(anonymous_namespace)::TransformActionGenexStrip>_>
  local_e8;
  int local_e0 [2];
  _Base_ptr local_d8;
  undefined1 local_d0;
  unique_ptr<(anonymous_namespace)::TransformActionStrip,_std::default_delete<(anonymous_namespace)::TransformActionStrip>_>
  local_c8;
  int local_c0 [2];
  _Base_ptr local_b8;
  undefined1 local_b0;
  unique_ptr<(anonymous_namespace)::TransformActionToLower,_std::default_delete<(anonymous_namespace)::TransformActionToLower>_>
  local_a8;
  int local_a0 [2];
  _Base_ptr local_98;
  undefined1 local_90;
  unique_ptr<(anonymous_namespace)::TransformActionToUpper,_std::default_delete<(anonymous_namespace)::TransformActionToUpper>_>
  local_88;
  int local_80 [2];
  _Base_ptr local_78;
  undefined1 local_70;
  unique_ptr<(anonymous_namespace)::TransformActionPrepend,_std::default_delete<(anonymous_namespace)::TransformActionPrepend>_>
  local_68;
  int local_60 [2];
  _Base_ptr local_58;
  undefined1 local_50;
  unique_ptr<(anonymous_namespace)::TransformActionAppend,_std::default_delete<(anonymous_namespace)::TransformActionAppend>_>
  local_38;
  int local_30 [2];
  size_t local_28;
  size_t arity_local;
  unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
  *selector_local;
  iterator iStack_10;
  TransformAction action_local;
  iterator descriptor;
  
  local_28 = arity;
  arity_local = (size_t)selector;
  selector_local._4_4_ = action;
  bVar1 = std::
          set<(anonymous_namespace)::ActionDescriptor,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
          ::empty((set<(anonymous_namespace)::ActionDescriptor,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                   *)(anonymous_namespace)::Descriptors);
  if (bVar1) {
    local_30[1] = 0;
    local_30[0] = 1;
    std::make_unique<(anonymous_namespace)::TransformActionAppend>();
    pVar5 = std::
            set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
            ::
            emplace<cmList::TransformAction,char_const(&)[7],int,std::unique_ptr<(anonymous_namespace)::TransformActionAppend,std::default_delete<(anonymous_namespace)::TransformActionAppend>>>
                      ((set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
                        *)(anonymous_namespace)::Descriptors,(TransformAction *)(local_30 + 1),
                       (char (*) [7])0xfe6ad8,local_30,&local_38);
    local_58 = (_Base_ptr)pVar5.first._M_node;
    local_50 = pVar5.second;
    std::
    unique_ptr<(anonymous_namespace)::TransformActionAppend,_std::default_delete<(anonymous_namespace)::TransformActionAppend>_>
    ::~unique_ptr(&local_38);
    local_60[1] = 1;
    local_60[0] = 1;
    std::make_unique<(anonymous_namespace)::TransformActionPrepend>();
    pVar5 = std::
            set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
            ::
            emplace<cmList::TransformAction,char_const(&)[8],int,std::unique_ptr<(anonymous_namespace)::TransformActionPrepend,std::default_delete<(anonymous_namespace)::TransformActionPrepend>>>
                      ((set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
                        *)(anonymous_namespace)::Descriptors,(TransformAction *)(local_60 + 1),
                       (char (*) [8])"PREPEND",local_60,&local_68);
    local_78 = (_Base_ptr)pVar5.first._M_node;
    local_70 = pVar5.second;
    std::
    unique_ptr<(anonymous_namespace)::TransformActionPrepend,_std::default_delete<(anonymous_namespace)::TransformActionPrepend>_>
    ::~unique_ptr(&local_68);
    local_80[1] = 3;
    local_80[0] = 0;
    std::make_unique<(anonymous_namespace)::TransformActionToUpper>();
    pVar5 = std::
            set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
            ::
            emplace<cmList::TransformAction,char_const(&)[8],int,std::unique_ptr<(anonymous_namespace)::TransformActionToUpper,std::default_delete<(anonymous_namespace)::TransformActionToUpper>>>
                      ((set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
                        *)(anonymous_namespace)::Descriptors,(TransformAction *)(local_80 + 1),
                       (char (*) [8])"TOUPPER",local_80,&local_88);
    local_98 = (_Base_ptr)pVar5.first._M_node;
    local_90 = pVar5.second;
    std::
    unique_ptr<(anonymous_namespace)::TransformActionToUpper,_std::default_delete<(anonymous_namespace)::TransformActionToUpper>_>
    ::~unique_ptr(&local_88);
    local_a0[1] = 2;
    local_a0[0] = 0;
    std::make_unique<(anonymous_namespace)::TransformActionToLower>();
    pVar5 = std::
            set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
            ::
            emplace<cmList::TransformAction,char_const(&)[8],int,std::unique_ptr<(anonymous_namespace)::TransformActionToLower,std::default_delete<(anonymous_namespace)::TransformActionToLower>>>
                      ((set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
                        *)(anonymous_namespace)::Descriptors,(TransformAction *)(local_a0 + 1),
                       (char (*) [8])"TOLOWER",local_a0,&local_a8);
    local_b8 = (_Base_ptr)pVar5.first._M_node;
    local_b0 = pVar5.second;
    std::
    unique_ptr<(anonymous_namespace)::TransformActionToLower,_std::default_delete<(anonymous_namespace)::TransformActionToLower>_>
    ::~unique_ptr(&local_a8);
    local_c0[1] = 4;
    local_c0[0] = 0;
    std::make_unique<(anonymous_namespace)::TransformActionStrip>();
    pVar5 = std::
            set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
            ::
            emplace<cmList::TransformAction,char_const(&)[6],int,std::unique_ptr<(anonymous_namespace)::TransformActionStrip,std::default_delete<(anonymous_namespace)::TransformActionStrip>>>
                      ((set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
                        *)(anonymous_namespace)::Descriptors,(TransformAction *)(local_c0 + 1),
                       (char (*) [6])0xfdd173,local_c0,&local_c8);
    local_d8 = (_Base_ptr)pVar5.first._M_node;
    local_d0 = pVar5.second;
    std::
    unique_ptr<(anonymous_namespace)::TransformActionStrip,_std::default_delete<(anonymous_namespace)::TransformActionStrip>_>
    ::~unique_ptr(&local_c8);
    local_e0[1] = 5;
    local_e0[0] = 0;
    std::make_unique<(anonymous_namespace)::TransformActionGenexStrip>();
    pVar5 = std::
            set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
            ::
            emplace<cmList::TransformAction,char_const(&)[12],int,std::unique_ptr<(anonymous_namespace)::TransformActionGenexStrip,std::default_delete<(anonymous_namespace)::TransformActionGenexStrip>>>
                      ((set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
                        *)(anonymous_namespace)::Descriptors,(TransformAction *)(local_e0 + 1),
                       (char (*) [12])"GENEX_STRIP",local_e0,&local_e8);
    local_f8 = (_Base_ptr)pVar5.first._M_node;
    local_f0 = pVar5.second;
    std::
    unique_ptr<(anonymous_namespace)::TransformActionGenexStrip,_std::default_delete<(anonymous_namespace)::TransformActionGenexStrip>_>
    ::~unique_ptr(&local_e8);
    local_100[1] = 6;
    local_100[0] = 2;
    std::make_unique<(anonymous_namespace)::TransformActionReplace>();
    pVar5 = std::
            set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
            ::
            emplace<cmList::TransformAction,char_const(&)[8],int,std::unique_ptr<(anonymous_namespace)::TransformActionReplace,std::default_delete<(anonymous_namespace)::TransformActionReplace>>>
                      ((set<(anonymous_namespace)::ActionDescriptor,std::function<bool(cmList::TransformAction,cmList::TransformAction)>,std::allocator<(anonymous_namespace)::ActionDescriptor>>
                        *)(anonymous_namespace)::Descriptors,(TransformAction *)(local_100 + 1),
                       (char (*) [8])0xfb7a00,local_100,&local_108);
    local_118 = (_Base_ptr)pVar5.first._M_node;
    local_110 = pVar5.second;
    std::
    unique_ptr<(anonymous_namespace)::TransformActionReplace,_std::default_delete<(anonymous_namespace)::TransformActionReplace>_>
    ::~unique_ptr(&local_108);
  }
  ActionDescriptor::ActionDescriptor(&local_150,selector_local._4_4_);
  iStack_10 = std::
              set<(anonymous_namespace)::ActionDescriptor,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
              ::find((set<(anonymous_namespace)::ActionDescriptor,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)(anonymous_namespace)::Descriptors,&local_150);
  ActionDescriptor::~ActionDescriptor(&local_150);
  local_158._M_node =
       (_Base_ptr)
       std::
       set<(anonymous_namespace)::ActionDescriptor,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
       ::end((set<(anonymous_namespace)::ActionDescriptor,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
              *)(anonymous_namespace)::Descriptors);
  bVar1 = std::operator==(&stack0xfffffffffffffff0,&local_158);
  if (bVar1) {
    local_199 = 1;
    ptVar3 = (transform_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_198,selector_local._4_4_);
    cmStrCat<char_const(&)[25],std::__cxx11::string,char_const(&)[17]>
              (&local_178,(char (*) [25])" sub-command TRANSFORM, ",&local_198,
               (char (*) [17])" invalid action.");
    cmList::transform_error::transform_error(ptVar3,&local_178);
    local_199 = 0;
    __cxa_throw(ptVar3,&cmList::transform_error::typeinfo,cmList::transform_error::~transform_error)
    ;
  }
  pAVar2 = std::_Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor>::operator->
                     (&stack0xfffffffffffffff0);
  if (pAVar2->Arity == local_28) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)arity_local);
    if (!bVar1) {
      std::make_unique<(anonymous_namespace)::TransformNoSelector>();
      std::unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>::
      operator=((unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>
                 *)arity_local,&local_1d0);
      std::
      unique_ptr<(anonymous_namespace)::TransformNoSelector,_std::default_delete<(anonymous_namespace)::TransformNoSelector>_>
      ::~unique_ptr(&local_1d0);
    }
    return (iterator)iStack_10._M_node;
  }
  local_1c1 = 1;
  ptVar3 = (transform_error *)__cxa_allocate_exception(0x10);
  pAVar2 = std::_Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor>::operator->
                     (&stack0xfffffffffffffff0);
  pAVar4 = std::_Rb_tree_const_iterator<(anonymous_namespace)::ActionDescriptor>::operator->
                     (&stack0xfffffffffffffff0);
  cmStrCat<char_const(&)[31],std::__cxx11::string_const&,char_const(&)[10],unsigned_long_const&,char_const(&)[14]>
            (&local_1c0,(char (*) [31])"sub-command TRANSFORM, action ",&pAVar2->Name,
             (char (*) [10])" expects ",&pAVar4->Arity,(char (*) [14])0xfaf2f3);
  cmList::transform_error::transform_error(ptVar3,&local_1c0);
  local_1c1 = 0;
  __cxa_throw(ptVar3,&cmList::transform_error::typeinfo,cmList::transform_error::~transform_error);
}

Assistant:

ActionDescriptorSet::iterator TransformConfigure(
  cmList::TransformAction action,
  std::unique_ptr<cmList::TransformSelector>& selector, std::size_t arity)
{
  if (Descriptors.empty()) {
    Descriptors.emplace(cmList::TransformAction::APPEND, "APPEND", 1,
                        cm::make_unique<TransformActionAppend>());
    Descriptors.emplace(cmList::TransformAction::PREPEND, "PREPEND", 1,
                        cm::make_unique<TransformActionPrepend>());
    Descriptors.emplace(cmList::TransformAction::TOUPPER, "TOUPPER", 0,
                        cm::make_unique<TransformActionToUpper>());
    Descriptors.emplace(cmList::TransformAction::TOLOWER, "TOLOWER", 0,
                        cm::make_unique<TransformActionToLower>());
    Descriptors.emplace(cmList::TransformAction::STRIP, "STRIP", 0,
                        cm::make_unique<TransformActionStrip>());
    Descriptors.emplace(cmList::TransformAction::GENEX_STRIP, "GENEX_STRIP", 0,
                        cm::make_unique<TransformActionGenexStrip>());
    Descriptors.emplace(cmList::TransformAction::REPLACE, "REPLACE", 2,
                        cm::make_unique<TransformActionReplace>());
  }

  auto descriptor = Descriptors.find(action);
  if (descriptor == Descriptors.end()) {
    throw transform_error(cmStrCat(" sub-command TRANSFORM, ",
                                   std::to_string(static_cast<int>(action)),
                                   " invalid action."));
  }

  if (descriptor->Arity != arity) {
    throw transform_error(cmStrCat("sub-command TRANSFORM, action ",
                                   descriptor->Name, " expects ",
                                   descriptor->Arity, " argument(s)."));
  }
  if (!selector) {
    selector = cm::make_unique<TransformNoSelector>();
  }

  return descriptor;
}